

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_hmac.c
# Opt level: O3

int csp_hmac_verify(csp_packet_t *packet,_Bool include_header)

{
  int iVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint8_t hmac [20];
  int local_28 [6];
  
  iVar1 = -100;
  if (3 < packet->length) {
    if (include_header) {
      csp_hmac_memory(csp_hmac_key,0x10,(packet->field_0).field_1.frame_begin,
                      (packet->field_0).field_1.frame_length - 4,(uint8_t *)local_28);
      uVar2 = (packet->field_0).field_1.frame_length;
      if (*(int *)((packet->field_0).field_1.frame_begin + ((ulong)uVar2 - 4)) != local_28[0]) {
        return -100;
      }
      puVar3 = &(packet->field_0).field_1.frame_length;
    }
    else {
      csp_hmac_memory(csp_hmac_key,0x10,&packet->field_5,packet->length - 4,(uint8_t *)local_28);
      uVar2 = packet->length;
      if (*(int *)(packet->header + (ulong)uVar2 + 4) != local_28[0]) {
        return -100;
      }
      puVar3 = &packet->length;
    }
    *puVar3 = uVar2 - 4;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int csp_hmac_verify(csp_packet_t * packet, bool include_header) {

	if (packet->length < (unsigned int)CSP_HMAC_LENGTH) {
		return CSP_ERR_HMAC;
	}

	uint8_t hmac[CSP_SHA1_DIGESTSIZE];

	/* Calculate HMAC */
	if (include_header) {

		csp_hmac_memory(csp_hmac_key, sizeof(csp_hmac_key), packet->frame_begin, packet->frame_length - CSP_HMAC_LENGTH, hmac);

		/* Compare calculated HMAC with packet header */
		if (memcmp(&packet->frame_begin[packet->frame_length] - CSP_HMAC_LENGTH, hmac, CSP_HMAC_LENGTH) != 0) {
			/* HMAC failed */
			return CSP_ERR_HMAC;
		}

		/* Strip HMAC */
		packet->frame_length -= CSP_HMAC_LENGTH;

	} else {
		csp_hmac_memory(csp_hmac_key, sizeof(csp_hmac_key), packet->data, packet->length - CSP_HMAC_LENGTH, hmac);

		/* Compare calculated HMAC with packet header */
		if (memcmp(&packet->data[packet->length] - CSP_HMAC_LENGTH, hmac, CSP_HMAC_LENGTH) != 0) {
			/* HMAC failed */
			return CSP_ERR_HMAC;
		}

		/* Strip HMAC */
		packet->length -= CSP_HMAC_LENGTH;
	}

	return CSP_ERR_NONE;
}